

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week9-hw.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_80 [8];
  vector<Student,_std::allocator<Student>_> v2;
  undefined1 local_50 [8];
  vector<Student,_std::allocator<Student>_> v1;
  Course *course;
  iterator __end1;
  iterator __begin1;
  Courses *__range1;
  char **param_1_local;
  int param_0_local;
  
  __end1 = std::vector<Course,_std::allocator<Course>_>::begin(&courses);
  course = (Course *)std::vector<Course,_std::allocator<Course>_>::end(&courses);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<Course_*,_std::vector<Course,_std::allocator<Course>_>_>
                      (&__end1,(__normal_iterator<Course_*,_std::vector<Course,_std::allocator<Course>_>_>
                                *)&course);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    v1.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<Course_*,_std::vector<Course,_std::allocator<Course>_>_>::
                  operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout,"Course Code is ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    v1.super__Vector_base<Student,_std::allocator<Student>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    filter<std::vector<Student,std::allocator<Student>>,main::__0>
              ((vector<Student,_std::allocator<Student>_> *)local_50,&students,
               (anon_class_8_1_5066d159)
               v1.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    print((vector<Student,_std::allocator<Student>_> *)local_50);
    std::vector<Student,_std::allocator<Student>_>::~vector
              ((vector<Student,_std::allocator<Student>_> *)local_50);
    __gnu_cxx::__normal_iterator<Course_*,_std::vector<Course,_std::allocator<Course>_>_>::
    operator++(&__end1);
  }
  filter<std::vector<Student,std::allocator<Student>>,main::__1>((Students *)local_80,&students);
  print((Students *)local_80);
  std::vector<Student,_std::allocator<Student>_>::~vector
            ((vector<Student,_std::allocator<Student>_> *)local_80);
  return 0;
}

Assistant:

int main(int, char*[])
{
    // use filter algorithm on students for filtering the students
    // who has taken CS401 course before, then write the names of the students with print(v1)
    for(const auto& course : courses)
    {
        cout << "Course Code is " << course.code << endl;
        auto v1 = filter(students, [&](const Student& s) {
            return s.has_taken_course(course.code);
        });
        print(v1);
    }

    // use filter algorithm on students for filtering the students
    // who has taken at least 3 courses before, then write the names of the students with print(v2)
    auto v2 = filter(students, [](const Student& s) {
        return s.num_taken_courses() >= 3;
    });
    print(v2);

    return 0;
}